

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolsb.c
# Opt level: O0

int ffggpsb(fitsfile *fptr,long group,long firstelem,long nelem,char *array,int *status)

{
  int *in_R9;
  char cdummy;
  int idummy;
  long row;
  long in_stack_00007230;
  LONGLONG in_stack_00007238;
  LONGLONG in_stack_00007240;
  LONGLONG in_stack_00007248;
  int in_stack_00007254;
  fitsfile *in_stack_00007258;
  int in_stack_000072a0;
  char in_stack_000072a8;
  char *in_stack_000072b0;
  char *in_stack_000072b8;
  int *in_stack_000072c0;
  int *in_stack_000072c8;
  
  ffgclsb(in_stack_00007258,in_stack_00007254,in_stack_00007248,in_stack_00007240,in_stack_00007238,
          in_stack_00007230,in_stack_000072a0,in_stack_000072a8,in_stack_000072b0,in_stack_000072b8,
          in_stack_000072c0,in_stack_000072c8);
  return *in_R9;
}

Assistant:

int ffggpsb( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            long  firstelem,  /* I - first vector element to read (1 = 1st)  */
            long  nelem,      /* I - number of values to read                */
            signed char *array,   /* O - array of values that are returned   */
            int  *status)     /* IO - error status                           */
/*
  Read an array of group parameters from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
*/
{
    long row;
    int idummy;
    char cdummy;
    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgclsb(fptr, 1, row, firstelem, nelem, 1, 1, 0,
               array, &cdummy, &idummy, status);
    return(*status);
}